

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O0

int PrecSetupBD(N_Vector cc,N_Vector cscale,N_Vector fval,N_Vector fscale,void *user_data)

{
  long lVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  long *in_RDI;
  long in_R8;
  UserData data;
  sunindextype ret;
  sunindextype jy;
  sunindextype jx;
  sunindextype j;
  sunindextype i;
  sunrealtype perturb_rates [6];
  sunrealtype *Pxycol;
  sunrealtype *ratesxy;
  sunrealtype **Pxy;
  sunrealtype *scxy;
  sunrealtype *cxy;
  sunrealtype fac;
  sunrealtype csave;
  sunrealtype dely;
  sunrealtype delx;
  sunrealtype yy;
  sunrealtype xx;
  sunrealtype sqruround;
  sunrealtype uround;
  sunrealtype r0;
  sunrealtype r;
  double local_110;
  void *in_stack_ffffffffffffff00;
  sunrealtype *ratesxy_00;
  sunrealtype *cxy_00;
  sunrealtype yy_00;
  sunrealtype in_stack_ffffffffffffff20;
  double local_d8 [6];
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  long *local_18;
  long *local_10;
  
  local_68 = *(double *)(in_R8 + 0x438);
  local_70 = *(double *)(in_R8 + 0x440);
  local_48 = *(double *)(in_R8 + 0x448);
  local_50 = *(double *)(in_R8 + 0x450);
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_80 = (double)N_VWL2Norm(in_RDX,in_RCX);
  local_40 = local_48 * 1000.0 * local_80 * 384.0;
  if ((local_40 == 0.0) && (!NAN(local_40))) {
    local_40 = 1.0;
  }
  ratesxy_00 = (sunrealtype *)0x0;
  do {
    if (7 < (long)ratesxy_00) {
      return 0;
    }
    local_60 = (double)(long)ratesxy_00 * local_70;
    for (cxy_00 = (sunrealtype *)0x0; (long)cxy_00 < 8; cxy_00 = (sunrealtype *)((long)cxy_00 + 1))
    {
      local_58 = (double)(long)cxy_00 * local_68;
      local_98 = *(long *)(in_R8 + (long)cxy_00 * 0x40 + (long)ratesxy_00 * 8);
      local_88 = *(long *)(*local_10 + 0x10) + ((long)cxy_00 * 6 + (long)ratesxy_00 * 0x30) * 8;
      local_90 = *(long *)(*local_18 + 0x10) + ((long)cxy_00 * 6 + (long)ratesxy_00 * 0x30) * 8;
      local_a0 = *(long *)(**(long **)(in_R8 + 0x410) + 0x10) +
                 ((long)cxy_00 * 6 + (long)ratesxy_00 * 0x30) * 8;
      for (yy_00 = 0.0; (long)yy_00 < 6; yy_00 = (sunrealtype)((long)yy_00 + 1)) {
        local_78 = *(double *)(local_88 + (long)yy_00 * 8);
        if (local_50 * ABS(local_78) <= local_40 / *(double *)(local_90 + (long)yy_00 * 8)) {
          local_110 = local_40 / *(double *)(local_90 + (long)yy_00 * 8);
        }
        else {
          local_110 = local_50 * ABS(local_78);
        }
        local_38 = local_110;
        *(double *)(local_88 + (long)yy_00 * 8) =
             local_110 + *(double *)(local_88 + (long)yy_00 * 8);
        local_80 = 1.0 / local_110;
        WebRate(in_stack_ffffffffffffff20,yy_00,cxy_00,ratesxy_00,in_stack_ffffffffffffff00);
        *(double *)(local_88 + (long)yy_00 * 8) = local_78;
        local_a8 = *(long *)(local_98 + (long)yy_00 * 8);
        for (in_stack_ffffffffffffff20 = 0.0; (long)in_stack_ffffffffffffff20 < 6;
            in_stack_ffffffffffffff20 = (sunrealtype)((long)in_stack_ffffffffffffff20 + 1)) {
          *(double *)(local_a8 + (long)in_stack_ffffffffffffff20 * 8) =
               (local_d8[(long)in_stack_ffffffffffffff20] -
               *(double *)(local_a0 + (long)in_stack_ffffffffffffff20 * 8)) * local_80;
        }
      }
      lVar1 = SUNDlsMat_denseGETRF
                        (local_98,6,6,
                         *(undefined8 *)(in_R8 + 0x200 + (long)cxy_00 * 0x40 + (long)ratesxy_00 * 8)
                        );
      if (lVar1 != 0) {
        return 1;
      }
      in_stack_ffffffffffffff00 = (void *)0x0;
    }
    ratesxy_00 = (sunrealtype *)((long)ratesxy_00 + 1);
  } while( true );
}

Assistant:

static int PrecSetupBD(N_Vector cc, N_Vector cscale, N_Vector fval,
                       N_Vector fscale, void* user_data)
{
  sunrealtype r, r0, uround, sqruround, xx, yy, delx, dely, csave, fac;
  sunrealtype *cxy, *scxy, **Pxy, *ratesxy, *Pxycol, perturb_rates[NUM_SPECIES];
  sunindextype i, j, jx, jy, ret;
  UserData data;

  data = (UserData)user_data;
  delx = data->dx;
  dely = data->dy;

  uround    = data->uround;
  sqruround = data->sqruround;
  fac       = N_VWL2Norm(fval, fscale);
  r0        = THOUSAND * uround * fac * NEQ;
  if (r0 == ZERO) { r0 = ONE; }

  /* Loop over spatial points; get size NUM_SPECIES Jacobian block at each */
  for (jy = 0; jy < MY; jy++)
  {
    yy = jy * dely;

    for (jx = 0; jx < MX; jx++)
    {
      xx      = jx * delx;
      Pxy     = (data->P)[jx][jy];
      cxy     = IJ_Vptr(cc, jx, jy);
      scxy    = IJ_Vptr(cscale, jx, jy);
      ratesxy = IJ_Vptr((data->rates), jx, jy);

      /* Compute difference quotients of interaction rate fn. */
      for (j = 0; j < NUM_SPECIES; j++)
      {
        csave = cxy[j]; /* Save the j,jx,jy element of cc */
        r     = SUNMAX(sqruround * SUNRabs(csave), r0 / scxy[j]);
        cxy[j] += r; /* Perturb the j,jx,jy element of cc */
        fac = ONE / r;

        WebRate(xx, yy, cxy, perturb_rates, data);

        /* Restore j,jx,jy element of cc */
        cxy[j] = csave;

        /* Load the j-th column of difference quotients */
        Pxycol = Pxy[j];
        for (i = 0; i < NUM_SPECIES; i++)
        {
          Pxycol[i] = (perturb_rates[i] - ratesxy[i]) * fac;
        }

      } /* end of j loop */

      /* Do LU decomposition of size NUM_SPECIES preconditioner block */
      ret = SUNDlsMat_denseGETRF(Pxy, NUM_SPECIES, NUM_SPECIES,
                                 (data->pivot)[jx][jy]);
      if (ret != 0) { return (1); }

    } /* end of jx loop */

  } /* end of jy loop */

  return (0);
}